

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

expression_base_value_f effect_value_base_by_name(char *name)

{
  wchar_t wVar1;
  bool bVar2;
  value_base_s *local_20;
  value_base_s *current;
  char *name_local;
  
  local_20 = effect_value_base_by_name::value_bases;
  while( true ) {
    bVar2 = false;
    if (local_20->name != (char *)0x0) {
      bVar2 = local_20->function != (expression_base_value_f)0x0;
    }
    if (!bVar2) break;
    wVar1 = my_stricmp(name,local_20->name);
    if (wVar1 == L'\0') {
      return local_20->function;
    }
    local_20 = local_20 + 1;
  }
  return (expression_base_value_f)0x0;
}

Assistant:

expression_base_value_f effect_value_base_by_name(const char *name)
{
	static const struct value_base_s {
		const char *name;
		expression_base_value_f function;
	} value_bases[] = {
		{ "SPELL_POWER", effect_value_base_spell_power },
		{ "PLAYER_LEVEL", effect_value_base_player_level },
		{ "DUNGEON_LEVEL", effect_value_base_dungeon_level },
		{ "MAX_SIGHT", effect_value_base_max_sight },
		{ "WEAPON_DAMAGE", effect_value_base_weapon_damage },
		{ "PLAYER_HP", effect_value_base_player_hp },
		{ "MONSTER_PERCENT_HP_GONE",
		  effect_value_base_monster_percent_hp_gone },
		{ "TRAP_POWER", effect_value_base_trap_power },
		{ NULL, NULL },
	};
	const struct value_base_s *current = value_bases;

	while (current->name != NULL && current->function != NULL) {
		if (my_stricmp(name, current->name) == 0)
			return current->function;

		current++;
	}

	return NULL;
}